

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

int cmGetTotalArgumentSize(int argc,char **argv)

{
  size_t sVar1;
  int local_20;
  int local_1c;
  int result;
  int i;
  char **argv_local;
  int argc_local;
  
  local_20 = 0;
  for (local_1c = 0; local_1c < argc; local_1c = local_1c + 1) {
    if (argv[local_1c] != (char *)0x0) {
      sVar1 = strlen(argv[local_1c]);
      local_20 = local_20 + (int)sVar1;
    }
  }
  return local_20;
}

Assistant:

static int CCONV cmGetTotalArgumentSize(int argc, char** argv)
{
  int i;
  int result = 0;
  for (i = 0; i < argc; ++i) {
    if (argv[i]) {
      result = result + static_cast<int>(strlen(argv[i]));
    }
  }
  return result;
}